

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O0

void __thiscall axl::sys::TlsMgr::~TlsMgr(TlsMgr *this)

{
  Page *page_00;
  Page *in_RDI;
  Page *page;
  
  page_00 = findCurrentThreadPage((TlsMgr *)0x1a4b58);
  if (page_00 != (Page *)0x0) {
    if (page_00 != (Page *)0x0) {
      Page::~Page(in_RDI);
      operator_delete(page_00);
    }
    setCurrentThreadPage((TlsMgr *)in_RDI,page_00);
  }
  pthread_key_delete(*(pthread_key_t *)
                      &(in_RDI->m_array).
                       super_ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                       .m_p);
  return;
}

Assistant:

TlsMgr::~TlsMgr() {
	Page* page = findCurrentThreadPage();
	if (page) {
		delete page;
		setCurrentThreadPage(NULL);
	}

	::pthread_key_delete(m_tlsKey);
}